

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::arrayStr<tcu::Vector<int,2>,5>
          (string *__return_storage_ptr__,Functional *this,Vector<int,_2> (*arr) [5])

{
  Vector<int,_2> *extraout_RDX;
  Vector<int,_2> *value;
  Vector<int,_2> *extraout_RDX_00;
  bool *__lhs;
  long lVar1;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"{ ",(allocator<char> *)&local_50);
  value = extraout_RDX;
  for (lVar1 = 0; lVar1 != 0x28; lVar1 = lVar1 + 8) {
    de::toString<tcu::Vector<int,2>>(&local_70,(de *)(this + lVar1),value);
    __lhs = (bool *)0x87bce4;
    if (lVar1 == 0) {
      __lhs = SSBOArrayLengthTests::init::arraysSized + 1;
    }
    std::operator+(&local_50,__lhs,&local_70);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    value = extraout_RDX_00;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static string arrayStr (const T (&arr)[Size])
{
	string result = "{ ";
	for (int i = 0; i < Size; i++)
		result += (i > 0 ? ", " : "") + toString(arr[i]);
	result += " }";
	return result;
}